

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

Maybe<capnp::schema::Value::Reader> * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::annotationValue<capnp::schema::Node::Reader>
          (Maybe<capnp::schema::Value::Reader> *__return_storage_ptr__,CapnpcCppMain *this,
          Reader proto,uint64_t annotationId)

{
  CapnpcCppMain *pCVar1;
  IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
  local_98;
  Reader local_88;
  Reader local_58;
  
  capnp::schema::Node::Reader::getAnnotations(&local_58,&proto);
  local_98.index = 0;
  local_98.container = &local_58;
  while( true ) {
    if (local_98.index == local_58.reader.elementCount) {
      (__return_storage_ptr__->ptr).isSet = false;
      return __return_storage_ptr__;
    }
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
    ::operator*(&local_88,&local_98);
    if (local_88._reader.dataSize < 0x40) {
      pCVar1 = (CapnpcCppMain *)0x0;
    }
    else {
      pCVar1 = *local_88._reader.data;
    }
    if (pCVar1 == this) break;
    local_98.index = local_98.index + 1;
  }
  capnp::schema::Annotation::Reader::getValue
            (&(__return_storage_ptr__->ptr).field_1.value,&local_88);
  (__return_storage_ptr__->ptr).isSet = true;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<schema::Value::Reader> annotationValue(P proto, uint64_t annotationId) {
    for (auto annotation: proto.getAnnotations()) {
      if (annotation.getId() == annotationId) {
        return annotation.getValue();
      }
    }
    return nullptr;
  }